

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniformxx.hpp
# Opt level: O0

ret_t trng::utility::
      u01xx_traits<float,_1UL,_generator_max<trng::lagfib4plus<unsigned_long,_168U,_205U,_242U,_521U>_>_>
      ::variate(generator_max<trng::lagfib4plus<unsigned_long,_168U,_205U,_242U,_521U>_> *r)

{
  ret_t rVar1;
  size_t i;
  ret_t ret;
  ret_t scale_per_step;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  rVar1 = addin((generator_max<trng::lagfib4plus<unsigned_long,_168U,_205U,_242U,_521U>_> *)
                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  return rVar1;
}

Assistant:

TRNG_CUDA_ENABLE
      static ret_t variate(prng_t &r) {
        static_assert(prng_t::min() >= 0 and prng_t::max() > prng_t::min(),
                      "min max out of range");  // min and/or max out of spec?
        static_assert(prng_t::max() - prng_t::min() <= ~0ull,
                      "min max have exotic values/types");  // Bits, Holes incorrect otherwise
        static_assert(not math::numeric_limits<return_type>::is_integer, "not an integer");
        static_assert(calls_needed > 0 and calls_needed <= bits, "illegal number of calls");
        const ret_t scale_per_step(ret_t(domain_max) + 1);
        ret_t ret{addin(r)};
        for (std::size_t i{1}; i < calls_needed; ++i)
          ret = ret * scale_per_step + addin(r);
        return ret;
      }